

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

void warning(char *stptr)

{
  int iVar1;
  char *pcVar2;
  
  pcVar2 = prlnbuf + 4;
  for (iVar1 = slnum; iVar1 != 0; iVar1 = iVar1 / 10) {
    *pcVar2 = (char)(iVar1 % 10) + '0';
    pcVar2 = pcVar2 + -1;
  }
  if (infile_error != infile_num) {
    infile_error = infile_num;
    printf("#[%i]   %s\n",(long)infile_num,(long)infile_num * 0x88 + 0x11ed20);
  }
  loadlc(loccnt,0);
  puts(prlnbuf);
  printf("       %s\n",stptr);
  return;
}

Assistant:

void
warning(char *stptr)
{
	int i, temp;

	/* put the source line number into prlnbuf */
	i = 4;
	temp = slnum;
	while (temp != 0) {
		prlnbuf[i--] = temp % 10 + '0';
		temp /= 10;
	}

	/* update the current file name */
	if (infile_error != infile_num) {
		infile_error  = infile_num;
		printf("#[%i]   %s\n", infile_num, input_file[infile_num].name);
	}

	/* output the line and the error message */
	loadlc(loccnt, 0);
	printf("%s\n", prlnbuf);
	printf("       %s\n", stptr);
}